

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

int mbedtls_mpi_exp_mod(mbedtls_mpi *X,mbedtls_mpi *A,mbedtls_mpi *E,mbedtls_mpi *N,
                       mbedtls_mpi *prec_RR)

{
  int iVar1;
  size_t sVar2;
  ulong T_size;
  bool bVar3;
  int local_11c;
  int local_118;
  int local_114;
  size_t x_index;
  size_t w_table_used_size;
  undefined1 local_f8 [4];
  int neg;
  mbedtls_mpi Apos;
  mbedtls_mpi WW;
  mbedtls_mpi W [2];
  undefined1 local_b0 [8];
  mbedtls_mpi T;
  mbedtls_mpi RR;
  mbedtls_mpi_uint state;
  mbedtls_mpi_uint mm;
  mbedtls_mpi_uint ei;
  size_t exponent_bits_in_window;
  size_t nbits;
  size_t bufsize;
  size_t nblimbs;
  size_t j;
  size_t i;
  size_t window_bitsize;
  mbedtls_mpi *pmStack_38;
  int ret;
  mbedtls_mpi *prec_RR_local;
  mbedtls_mpi *N_local;
  mbedtls_mpi *E_local;
  mbedtls_mpi *A_local;
  mbedtls_mpi *X_local;
  
  window_bitsize._4_4_ = 0xffffff92;
  ei = 0;
  pmStack_38 = prec_RR;
  prec_RR_local = N;
  N_local = E;
  E_local = A;
  A_local = X;
  iVar1 = mbedtls_mpi_cmp_int(N,0);
  if ((iVar1 < 1) || ((*prec_RR_local->p & 1) == 0)) {
    return -4;
  }
  iVar1 = mbedtls_mpi_cmp_int(N_local,0);
  if (iVar1 < 0) {
    return -4;
  }
  sVar2 = mbedtls_mpi_bitlen(N_local);
  if ((0x100 < sVar2) || (sVar2 = mbedtls_mpi_bitlen(prec_RR_local), 0x100 < sVar2)) {
    return -4;
  }
  mpi_montg_init(&state,prec_RR_local);
  mbedtls_mpi_init((mbedtls_mpi *)&T.s);
  mbedtls_mpi_init((mbedtls_mpi *)local_b0);
  mbedtls_mpi_init((mbedtls_mpi *)local_f8);
  mbedtls_mpi_init((mbedtls_mpi *)&Apos.s);
  memset(&WW.s,0,0x20);
  j = mbedtls_mpi_bitlen(N_local);
  if (j < 0x2a0) {
    if (j < 0xf0) {
      if (j < 0x50) {
        local_11c = 1;
        if (0x17 < j) {
          local_11c = 3;
        }
      }
      else {
        local_11c = 4;
      }
      local_118 = local_11c;
    }
    else {
      local_118 = 5;
    }
    local_114 = local_118;
  }
  else {
    local_114 = 6;
  }
  i = (size_t)local_114;
  if (1 < i) {
    i = 1;
  }
  T_size = 1L << (sbyte)i;
  mbedtls_mpi_init((mbedtls_mpi *)&WW.s);
  nblimbs = (size_t)(int)(prec_RR_local->n + 1);
  window_bitsize._4_4_ = mbedtls_mpi_grow((mbedtls_mpi *)&WW.s,nblimbs);
  if (((window_bitsize._4_4_ == 0) &&
      (window_bitsize._4_4_ = mbedtls_mpi_grow((mbedtls_mpi *)&W[0].s,nblimbs),
      window_bitsize._4_4_ == 0)) &&
     (window_bitsize._4_4_ = mbedtls_mpi_grow((mbedtls_mpi *)local_b0,nblimbs << 1),
     window_bitsize._4_4_ == 0)) {
    bVar3 = E_local->s == -1;
    if (bVar3) {
      window_bitsize._4_4_ = mbedtls_mpi_copy((mbedtls_mpi *)local_f8,E_local);
      if (window_bitsize._4_4_ != 0) goto LAB_00290bbc;
      Apos.p._0_2_ = 1;
      E_local = (mbedtls_mpi *)local_f8;
    }
    window_bitsize._4_4_ = 0;
    if ((pmStack_38 == (mbedtls_mpi *)0x0) || (pmStack_38->p == (mbedtls_mpi_uint *)0x0)) {
      window_bitsize._4_4_ = mbedtls_mpi_lset((mbedtls_mpi *)&T.s,1);
      if ((window_bitsize._4_4_ != 0) ||
         ((window_bitsize._4_4_ =
                mbedtls_mpi_shift_l((mbedtls_mpi *)&T.s,
                                    (long)(int)((uint)prec_RR_local->n << 1) << 6),
          window_bitsize._4_4_ != 0 ||
          (window_bitsize._4_4_ =
                mbedtls_mpi_mod_mpi((mbedtls_mpi *)&T.s,(mbedtls_mpi *)&T.s,prec_RR_local),
          window_bitsize._4_4_ != 0)))) goto LAB_00290bbc;
      if (pmStack_38 != (mbedtls_mpi *)0x0) {
        pmStack_38->p = (mbedtls_mpi_uint *)T._8_8_;
        *(mbedtls_mpi_uint **)&pmStack_38->s = RR.p;
      }
    }
    else {
      T._8_8_ = pmStack_38->p;
    }
    window_bitsize._4_4_ = 0;
    iVar1 = mbedtls_mpi_cmp_mpi(E_local,prec_RR_local);
    if (iVar1 < 0) {
      window_bitsize._4_4_ = mbedtls_mpi_copy((mbedtls_mpi *)&W[0].s,E_local);
    }
    else {
      window_bitsize._4_4_ = mbedtls_mpi_mod_mpi((mbedtls_mpi *)&W[0].s,E_local,prec_RR_local);
      if (window_bitsize._4_4_ != 0) goto LAB_00290bbc;
      window_bitsize._4_4_ =
           mbedtls_mpi_grow((mbedtls_mpi *)&W[0].s,(long)(int)(prec_RR_local->n + 1));
    }
    if (window_bitsize._4_4_ == 0) {
      window_bitsize._4_4_ = 0;
      mpi_montmul((mbedtls_mpi *)&W[0].s,(mbedtls_mpi *)&T.s,prec_RR_local,state,
                  (mbedtls_mpi *)local_b0);
      window_bitsize._4_4_ = mbedtls_mpi_copy((mbedtls_mpi *)&WW.s,(mbedtls_mpi *)&T.s);
      if (window_bitsize._4_4_ == 0) {
        mpi_montred((mbedtls_mpi *)&WW.s,prec_RR_local,state,(mbedtls_mpi *)local_b0);
        if (1 < i) {
          nblimbs = T_size >> 1;
          window_bitsize._4_4_ =
               mbedtls_mpi_grow((mbedtls_mpi *)&W[nblimbs - 1].s,(long)(int)(prec_RR_local->n + 1));
          if ((window_bitsize._4_4_ != 0) ||
             (window_bitsize._4_4_ =
                   mbedtls_mpi_copy((mbedtls_mpi *)&W[nblimbs - 1].s,(mbedtls_mpi *)&W[0].s),
             window_bitsize._4_4_ != 0)) goto LAB_00290bbc;
          window_bitsize._4_4_ = 0;
          for (j = 0; sVar2 = nblimbs, j < i - 1; j = j + 1) {
            mpi_montmul((mbedtls_mpi *)&W[nblimbs - 1].s,(mbedtls_mpi *)&W[nblimbs - 1].s,
                        prec_RR_local,state,(mbedtls_mpi *)local_b0);
          }
          while (j = sVar2 + 1, j < T_size) {
            window_bitsize._4_4_ =
                 mbedtls_mpi_grow((mbedtls_mpi *)&W[sVar2].s,(long)(int)(prec_RR_local->n + 1));
            if ((window_bitsize._4_4_ != 0) ||
               (window_bitsize._4_4_ =
                     mbedtls_mpi_copy((mbedtls_mpi *)&W[j - 1].s,(mbedtls_mpi *)&W[j - 2].s),
               window_bitsize._4_4_ != 0)) goto LAB_00290bbc;
            mpi_montmul((mbedtls_mpi *)&W[j - 1].s,(mbedtls_mpi *)&W[0].s,prec_RR_local,state,
                        (mbedtls_mpi *)local_b0);
            sVar2 = j;
          }
        }
        bufsize = (size_t)N_local->n;
        nbits = 0;
        exponent_bits_in_window = 0;
        RR.s = 0;
        RR.n = 0;
        RR._12_4_ = 0;
        while( true ) {
          do {
            while( true ) {
              do {
                if (nbits == 0) {
                  if (bufsize == 0) {
                    j = 0;
                    goto LAB_00290a3e;
                  }
                  bufsize = bufsize - 1;
                  nbits = 0x40;
                }
                nbits = nbits - 1;
                mm = N_local->p[bufsize] >> ((byte)nbits & 0x3f) & 1;
              } while ((mm == 0) && (RR._8_8_ == 0));
              if ((mm != 0) || (RR._8_8_ != 1)) break;
              window_bitsize._4_4_ =
                   mpi_select((mbedtls_mpi *)&Apos.s,(mbedtls_mpi *)&WW.s,T_size,0);
              if (window_bitsize._4_4_ != 0) goto LAB_00290bbc;
              mpi_montmul((mbedtls_mpi *)&WW.s,(mbedtls_mpi *)&Apos.s,prec_RR_local,state,
                          (mbedtls_mpi *)local_b0);
            }
            RR.s = 2;
            RR.n = 0;
            RR._12_4_ = 0;
            exponent_bits_in_window = exponent_bits_in_window + 1;
            ei = mm << ((char)i - (char)exponent_bits_in_window & 0x3fU) | ei;
          } while (exponent_bits_in_window != i);
          for (j = 0; j < i; j = j + 1) {
            window_bitsize._4_4_ = mpi_select((mbedtls_mpi *)&Apos.s,(mbedtls_mpi *)&WW.s,T_size,0);
            if (window_bitsize._4_4_ != 0) goto LAB_00290bbc;
            mpi_montmul((mbedtls_mpi *)&WW.s,(mbedtls_mpi *)&Apos.s,prec_RR_local,state,
                        (mbedtls_mpi *)local_b0);
          }
          window_bitsize._4_4_ = mpi_select((mbedtls_mpi *)&Apos.s,(mbedtls_mpi *)&WW.s,T_size,ei);
          if (window_bitsize._4_4_ != 0) break;
          mpi_montmul((mbedtls_mpi *)&WW.s,(mbedtls_mpi *)&Apos.s,prec_RR_local,state,
                      (mbedtls_mpi *)local_b0);
          RR.s = 1;
          RR.n = 0;
          RR._12_4_ = 0;
          exponent_bits_in_window = 0;
          ei = 0;
        }
      }
    }
  }
LAB_00290bbc:
  for (j = T_size >> 1; j < T_size; j = j + 1) {
    mbedtls_mpi_free((mbedtls_mpi *)&W[j - 1].s);
  }
  mbedtls_mpi_free((mbedtls_mpi *)&WW.s);
  mbedtls_mpi_free((mbedtls_mpi *)&W[0].s);
  mbedtls_mpi_free((mbedtls_mpi *)local_b0);
  mbedtls_mpi_free((mbedtls_mpi *)local_f8);
  mbedtls_mpi_free((mbedtls_mpi *)&Apos.s);
  if ((pmStack_38 == (mbedtls_mpi *)0x0) || (pmStack_38->p == (mbedtls_mpi_uint *)0x0)) {
    mbedtls_mpi_free((mbedtls_mpi *)&T.s);
  }
  return window_bitsize._4_4_;
LAB_00290a3e:
  if (exponent_bits_in_window <= j) goto LAB_00290b29;
  window_bitsize._4_4_ = mpi_select((mbedtls_mpi *)&Apos.s,(mbedtls_mpi *)&WW.s,T_size,0);
  if (window_bitsize._4_4_ != 0) goto LAB_00290bbc;
  mpi_montmul((mbedtls_mpi *)&WW.s,(mbedtls_mpi *)&Apos.s,prec_RR_local,state,
              (mbedtls_mpi *)local_b0);
  ei = ei << 1;
  if ((ei & 1L << ((byte)i & 0x3f)) != 0) {
    window_bitsize._4_4_ = mpi_select((mbedtls_mpi *)&Apos.s,(mbedtls_mpi *)&WW.s,T_size,1);
    if (window_bitsize._4_4_ != 0) goto LAB_00290bbc;
    mpi_montmul((mbedtls_mpi *)&WW.s,(mbedtls_mpi *)&Apos.s,prec_RR_local,state,
                (mbedtls_mpi *)local_b0);
  }
  j = j + 1;
  goto LAB_00290a3e;
LAB_00290b29:
  mpi_montred((mbedtls_mpi *)&WW.s,prec_RR_local,state,(mbedtls_mpi *)local_b0);
  if (((bVar3) && (N_local->n != 0)) && ((*N_local->p & 1) != 0)) {
    W[0].p._0_2_ = 0xffff;
    window_bitsize._4_4_ =
         mbedtls_mpi_add_mpi((mbedtls_mpi *)&WW.s,prec_RR_local,(mbedtls_mpi *)&WW.s);
    if (window_bitsize._4_4_ != 0) goto LAB_00290bbc;
    window_bitsize._4_4_ = 0;
  }
  window_bitsize._4_4_ = mbedtls_mpi_copy(A_local,(mbedtls_mpi *)&WW.s);
  goto LAB_00290bbc;
}

Assistant:

int mbedtls_mpi_exp_mod(mbedtls_mpi *X, const mbedtls_mpi *A,
                        const mbedtls_mpi *E, const mbedtls_mpi *N,
                        mbedtls_mpi *prec_RR)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t window_bitsize;
    size_t i, j, nblimbs;
    size_t bufsize, nbits;
    size_t exponent_bits_in_window = 0;
    mbedtls_mpi_uint ei, mm, state;
    mbedtls_mpi RR, T, W[(size_t) 1 << MBEDTLS_MPI_WINDOW_SIZE], WW, Apos;
    int neg;

    MPI_VALIDATE_RET(X != NULL);
    MPI_VALIDATE_RET(A != NULL);
    MPI_VALIDATE_RET(E != NULL);
    MPI_VALIDATE_RET(N != NULL);

    if (mbedtls_mpi_cmp_int(N, 0) <= 0 || (N->p[0] & 1) == 0) {
        return MBEDTLS_ERR_MPI_BAD_INPUT_DATA;
    }

    if (mbedtls_mpi_cmp_int(E, 0) < 0) {
        return MBEDTLS_ERR_MPI_BAD_INPUT_DATA;
    }

    if (mbedtls_mpi_bitlen(E) > MBEDTLS_MPI_MAX_BITS ||
        mbedtls_mpi_bitlen(N) > MBEDTLS_MPI_MAX_BITS) {
        return MBEDTLS_ERR_MPI_BAD_INPUT_DATA;
    }

    /*
     * Init temps and window size
     */
    mpi_montg_init(&mm, N);
    mbedtls_mpi_init(&RR); mbedtls_mpi_init(&T);
    mbedtls_mpi_init(&Apos);
    mbedtls_mpi_init(&WW);
    memset(W, 0, sizeof(W));

    i = mbedtls_mpi_bitlen(E);

    window_bitsize = (i > 671) ? 6 : (i > 239) ? 5 :
                     (i >  79) ? 4 : (i >  23) ? 3 : 1;

#if (MBEDTLS_MPI_WINDOW_SIZE < 6)
    if (window_bitsize > MBEDTLS_MPI_WINDOW_SIZE) {
        window_bitsize = MBEDTLS_MPI_WINDOW_SIZE;
    }
#endif

    const size_t w_table_used_size = (size_t) 1 << window_bitsize;

    /*
     * This function is not constant-trace: its memory accesses depend on the
     * exponent value. To defend against timing attacks, callers (such as RSA
     * and DHM) should use exponent blinding. However this is not enough if the
     * adversary can find the exponent in a single trace, so this function
     * takes extra precautions against adversaries who can observe memory
     * access patterns.
     *
     * This function performs a series of multiplications by table elements and
     * squarings, and we want the prevent the adversary from finding out which
     * table element was used, and from distinguishing between multiplications
     * and squarings. Firstly, when multiplying by an element of the window
     * W[i], we do a constant-trace table lookup to obfuscate i. This leaves
     * squarings as having a different memory access patterns from other
     * multiplications. So secondly, we put the accumulator in the table as
     * well, and also do a constant-trace table lookup to multiply by the
     * accumulator which is W[x_index].
     *
     * This way, all multiplications take the form of a lookup-and-multiply.
     * The number of lookup-and-multiply operations inside each iteration of
     * the main loop still depends on the bits of the exponent, but since the
     * other operations in the loop don't have an easily recognizable memory
     * trace, an adversary is unlikely to be able to observe the exact
     * patterns.
     *
     * An adversary may still be able to recover the exponent if they can
     * observe both memory accesses and branches. However, branch prediction
     * exploitation typically requires many traces of execution over the same
     * data, which is defeated by randomized blinding.
     */
    const size_t x_index = 0;
    mbedtls_mpi_init(&W[x_index]);

    j = N->n + 1;
    /* All W[i] including the accumulator must have at least N->n limbs for
     * the mpi_montmul() and mpi_montred() calls later. Here we ensure that
     * W[1] and the accumulator W[x_index] are large enough. later we'll grow
     * other W[i] to the same length. They must not be shrunk midway through
     * this function!
     */
    MBEDTLS_MPI_CHK(mbedtls_mpi_grow(&W[x_index], j));
    MBEDTLS_MPI_CHK(mbedtls_mpi_grow(&W[1],  j));
    MBEDTLS_MPI_CHK(mbedtls_mpi_grow(&T, j * 2));

    /*
     * Compensate for negative A (and correct at the end)
     */
    neg = (A->s == -1);
    if (neg) {
        MBEDTLS_MPI_CHK(mbedtls_mpi_copy(&Apos, A));
        Apos.s = 1;
        A = &Apos;
    }

    /*
     * If 1st call, pre-compute R^2 mod N
     */
    if (prec_RR == NULL || prec_RR->p == NULL) {
        MBEDTLS_MPI_CHK(mbedtls_mpi_lset(&RR, 1));
        MBEDTLS_MPI_CHK(mbedtls_mpi_shift_l(&RR, N->n * 2 * biL));
        MBEDTLS_MPI_CHK(mbedtls_mpi_mod_mpi(&RR, &RR, N));

        if (prec_RR != NULL) {
            memcpy(prec_RR, &RR, sizeof(mbedtls_mpi));
        }
    } else {
        memcpy(&RR, prec_RR, sizeof(mbedtls_mpi));
    }

    /*
     * W[1] = A * R^2 * R^-1 mod N = A * R mod N
     */
    if (mbedtls_mpi_cmp_mpi(A, N) >= 0) {
        MBEDTLS_MPI_CHK(mbedtls_mpi_mod_mpi(&W[1], A, N));
        /* This should be a no-op because W[1] is already that large before
         * mbedtls_mpi_mod_mpi(), but it's necessary to avoid an overflow
         * in mpi_montmul() below, so let's make sure. */
        MBEDTLS_MPI_CHK(mbedtls_mpi_grow(&W[1], N->n + 1));
    } else {
        MBEDTLS_MPI_CHK(mbedtls_mpi_copy(&W[1], A));
    }

    /* Note that this is safe because W[1] always has at least N->n limbs
     * (it grew above and was preserved by mbedtls_mpi_copy()). */
    mpi_montmul(&W[1], &RR, N, mm, &T);

    /*
     * W[x_index] = R^2 * R^-1 mod N = R mod N
     */
    MBEDTLS_MPI_CHK(mbedtls_mpi_copy(&W[x_index], &RR));
    mpi_montred(&W[x_index], N, mm, &T);


    if (window_bitsize > 1) {
        /*
         * W[i] = W[1] ^ i
         *
         * The first bit of the sliding window is always 1 and therefore we
         * only need to store the second half of the table.
         *
         * (There are two special elements in the table: W[0] for the
         * accumulator/result and W[1] for A in Montgomery form. Both of these
         * are already set at this point.)
         */
        j = w_table_used_size / 2;

        MBEDTLS_MPI_CHK(mbedtls_mpi_grow(&W[j], N->n + 1));
        MBEDTLS_MPI_CHK(mbedtls_mpi_copy(&W[j], &W[1]));

        for (i = 0; i < window_bitsize - 1; i++) {
            mpi_montmul(&W[j], &W[j], N, mm, &T);
        }

        /*
         * W[i] = W[i - 1] * W[1]
         */
        for (i = j + 1; i < w_table_used_size; i++) {
            MBEDTLS_MPI_CHK(mbedtls_mpi_grow(&W[i], N->n + 1));
            MBEDTLS_MPI_CHK(mbedtls_mpi_copy(&W[i], &W[i - 1]));

            mpi_montmul(&W[i], &W[1], N, mm, &T);
        }
    }

    nblimbs = E->n;
    bufsize = 0;
    nbits   = 0;
    state   = 0;

    while (1) {
        if (bufsize == 0) {
            if (nblimbs == 0) {
                break;
            }

            nblimbs--;

            bufsize = sizeof(mbedtls_mpi_uint) << 3;
        }

        bufsize--;

        ei = (E->p[nblimbs] >> bufsize) & 1;

        /*
         * skip leading 0s
         */
        if (ei == 0 && state == 0) {
            continue;
        }

        if (ei == 0 && state == 1) {
            /*
             * out of window, square W[x_index]
             */
            MBEDTLS_MPI_CHK(mpi_select(&WW, W, w_table_used_size, x_index));
            mpi_montmul(&W[x_index], &WW, N, mm, &T);
            continue;
        }

        /*
         * add ei to current window
         */
        state = 2;

        nbits++;
        exponent_bits_in_window |= (ei << (window_bitsize - nbits));

        if (nbits == window_bitsize) {
            /*
             * W[x_index] = W[x_index]^window_bitsize R^-1 mod N
             */
            for (i = 0; i < window_bitsize; i++) {
                MBEDTLS_MPI_CHK(mpi_select(&WW, W, w_table_used_size,
                                           x_index));
                mpi_montmul(&W[x_index], &WW, N, mm, &T);
            }

            /*
             * W[x_index] = W[x_index] * W[exponent_bits_in_window] R^-1 mod N
             */
            MBEDTLS_MPI_CHK(mpi_select(&WW, W, w_table_used_size,
                                       exponent_bits_in_window));
            mpi_montmul(&W[x_index], &WW, N, mm, &T);

            state--;
            nbits = 0;
            exponent_bits_in_window = 0;
        }
    }

    /*
     * process the remaining bits
     */
    for (i = 0; i < nbits; i++) {
        MBEDTLS_MPI_CHK(mpi_select(&WW, W, w_table_used_size, x_index));
        mpi_montmul(&W[x_index], &WW, N, mm, &T);

        exponent_bits_in_window <<= 1;

        if ((exponent_bits_in_window & ((size_t) 1 << window_bitsize)) != 0) {
            MBEDTLS_MPI_CHK(mpi_select(&WW, W, w_table_used_size, 1));
            mpi_montmul(&W[x_index], &WW, N, mm, &T);
        }
    }

    /*
     * W[x_index] = A^E * R * R^-1 mod N = A^E mod N
     */
    mpi_montred(&W[x_index], N, mm, &T);

    if (neg && E->n != 0 && (E->p[0] & 1) != 0) {
        W[x_index].s = -1;
        MBEDTLS_MPI_CHK(mbedtls_mpi_add_mpi(&W[x_index], N, &W[x_index]));
    }

    /*
     * Load the result in the output variable.
     */
    MBEDTLS_MPI_CHK(mbedtls_mpi_copy(X, &W[x_index]));

cleanup:

    /* The first bit of the sliding window is always 1 and therefore the first
     * half of the table was unused. */
    for (i = w_table_used_size/2; i < w_table_used_size; i++) {
        mbedtls_mpi_free(&W[i]);
    }

    mbedtls_mpi_free(&W[x_index]);
    mbedtls_mpi_free(&W[1]);
    mbedtls_mpi_free(&T);
    mbedtls_mpi_free(&Apos);
    mbedtls_mpi_free(&WW);

    if (prec_RR == NULL || prec_RR->p == NULL) {
        mbedtls_mpi_free(&RR);
    }

    return ret;
}